

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

void __thiscall
kratos::Enum::Enum(Enum *this,string *name,
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *values,uint32_t width)

{
  pointer pcVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  UserException *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  _Rb_tree_header *p_Var4;
  string_view format_str;
  format_args args;
  Generator *local_88;
  size_type sStack_80;
  undefined1 local_78 [8];
  shared_ptr<kratos::EnumConst> c;
  Enum *local_58;
  string *local_50;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>>
  *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  uint32_t local_38;
  undefined1 local_31;
  uint32_t width_local;
  
  (this->super_enable_shared_from_this<kratos::Enum>)._M_weak_this.
  super___weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_enable_shared_from_this<kratos::Enum>)._M_weak_this.
  super___weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>>
              *)&this->values;
  p_Var4 = &(this->values)._M_t._M_impl.super__Rb_tree_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var4->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var4->_M_header;
  (this->values)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_40 = &(this->name).field_2;
  (this->name)._M_dataplus._M_p = (pointer)local_40;
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38 = width;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + name->_M_string_length);
  this->external = false;
  this->width_ = width;
  this->local_ = true;
  local_50 = &this->name;
  bVar2 = is_valid_variable_name(name);
  if (bVar2) {
    p_Var3 = (values->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var4 = &(values->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      do {
        local_88 = Const::const_gen();
        local_58 = this;
        std::__shared_ptr<kratos::EnumConst,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<kratos::EnumConst>,kratos::Generator*,unsigned_long_const&,unsigned_int&,kratos::Enum*,std::__cxx11::string_const&>
                  ((__shared_ptr<kratos::EnumConst,(__gnu_cxx::_Lock_policy)2> *)local_78,
                   (allocator<kratos::EnumConst> *)&local_31,&local_88,(unsigned_long *)(p_Var3 + 2)
                   ,&local_38,&local_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                  );
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::EnumConst>>>>
        ::_M_emplace_unique<std::__cxx11::string_const&,std::shared_ptr<kratos::EnumConst>&>
                  (local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (p_Var3 + 1),(shared_ptr<kratos::EnumConst> *)local_78);
        if (c.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     c.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        }
        p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      } while ((_Rb_tree_header *)p_Var3 != p_Var4);
    }
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  local_88 = (Generator *)(name->_M_dataplus)._M_p;
  sStack_80 = name->_M_string_length;
  format_str.size_ = 0xd;
  format_str.data_ = (char *)0x1e;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_88;
  fmt::v7::detail::vformat_abi_cxx11_
            ((string *)local_78,(detail *)"{0} is a SystemVerilog keyword",format_str,args);
  UserException::UserException(this_00,(string *)local_78);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Enum::Enum(const std::string &name, const std::map<std::string, uint64_t> &values, uint32_t width)
    : name(name), width_(width) {
    if (!is_valid_variable_name(name)) {
        throw UserException(::format("{0} is a SystemVerilog keyword", name));
    }
    for (auto const &[n, value] : values) {
        auto c = std::make_shared<EnumConst>(Const::const_gen(), value, width, this, n);
        this->values.emplace(n, c);
    }
}